

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

void __thiscall
nonsugar::
basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::basic_command(basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *footer,
               tuple<> *flags,tuple<> *subcommands,
               tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *arguments)

{
  pointer pcVar1;
  
  (this->m_header)._M_dataplus._M_p = (pointer)&(this->m_header).field_2;
  pcVar1 = (header->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + header->_M_string_length)
  ;
  (this->m_footer)._M_dataplus._M_p = (pointer)&(this->m_footer).field_2;
  pcVar1 = (footer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_footer,pcVar1,pcVar1 + footer->_M_string_length);
  std::
  _Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'n',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::_Head_base((_Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                *)&this->m_arguments,
               (_Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                *)arguments);
  return;
}

Assistant:

basic_command(
        String const &header, String const &footer, Flags const &flags,
        Subcommands const &subcommands, Arguments const &arguments) :
        m_header(header), m_footer(footer), m_flags(flags), m_subcommands(subcommands),
        m_arguments(arguments)
    {}